

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

UBool ucnv_outputOverflowToUnicode
                (UConverter *cnv,UChar **target,UChar *targetLimit,int32_t **pOffsets,
                UErrorCode *err)

{
  char cVar1;
  int iVar2;
  UChar *pUVar3;
  int iVar4;
  int local_5c;
  int32_t j;
  int32_t length;
  int32_t i;
  UChar *t;
  UChar *overflow;
  int32_t *offsets;
  UErrorCode *err_local;
  int32_t **pOffsets_local;
  UChar *targetLimit_local;
  UChar **target_local;
  UConverter *cnv_local;
  
  if (pOffsets == (int32_t **)0x0) {
    overflow = (UChar *)0x0;
  }
  else {
    overflow = (UChar *)*pOffsets;
  }
  cVar1 = cnv->UCharErrorBufferLength;
  j = 0;
  _length = *target;
  while( true ) {
    if (cVar1 <= j) {
      cnv->UCharErrorBufferLength = '\0';
      *target = _length;
      if (overflow != (UChar *)0x0) {
        *pOffsets = (int32_t *)overflow;
      }
      return '\0';
    }
    if (_length == targetLimit) break;
    iVar2 = j + 1;
    pUVar3 = _length + 1;
    *_length = cnv->UCharErrorBuffer[j];
    j = iVar2;
    _length = pUVar3;
    if (overflow != (UChar *)0x0) {
      overflow[0] = L'\xffff';
      overflow[1] = L'\xffff';
      overflow = overflow + 2;
    }
  }
  local_5c = 0;
  do {
    iVar2 = j + 1;
    iVar4 = local_5c + 1;
    cnv->UCharErrorBuffer[local_5c] = cnv->UCharErrorBuffer[j];
    local_5c = iVar4;
    j = iVar2;
  } while (iVar2 < cVar1);
  cnv->UCharErrorBufferLength = (int8_t)iVar4;
  *target = _length;
  if (overflow != (UChar *)0x0) {
    *pOffsets = (int32_t *)overflow;
  }
  *err = U_BUFFER_OVERFLOW_ERROR;
  return '\x01';
}

Assistant:

static UBool
ucnv_outputOverflowToUnicode(UConverter *cnv,
                             UChar **target, const UChar *targetLimit,
                             int32_t **pOffsets,
                             UErrorCode *err) {
    int32_t *offsets;
    UChar *overflow, *t;
    int32_t i, length;

    t=*target;
    if(pOffsets!=NULL) {
        offsets=*pOffsets;
    } else {
        offsets=NULL;
    }

    overflow=cnv->UCharErrorBuffer;
    length=cnv->UCharErrorBufferLength;
    i=0;
    while(i<length) {
        if(t==targetLimit) {
            /* the overflow buffer contains too much, keep the rest */
            int32_t j=0;

            do {
                overflow[j++]=overflow[i++];
            } while(i<length);

            cnv->UCharErrorBufferLength=(int8_t)j;
            *target=t;
            if(offsets!=NULL) {
                *pOffsets=offsets;
            }
            *err=U_BUFFER_OVERFLOW_ERROR;
            return TRUE;
        }

        /* copy the overflow contents to the target */
        *t++=overflow[i++];
        if(offsets!=NULL) {
            *offsets++=-1; /* no source index available for old output */
        }
    }

    /* the overflow buffer is completely copied to the target */
    cnv->UCharErrorBufferLength=0;
    *target=t;
    if(offsets!=NULL) {
        *pOffsets=offsets;
    }
    return FALSE;
}